

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

char * sx_strncpy(char *dst,int dst_sz,char *src,int _num)

{
  char cVar1;
  ulong uVar2;
  code *pcVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  uint uVar9;
  char *pcVar10;
  long lVar11;
  char *src_00;
  int var__a;
  
  if (dst == (char *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                      0xd9,"dst");
    pcVar3 = (code *)swi(3);
    pcVar8 = (char *)(*pcVar3)();
    return pcVar8;
  }
  if (src == (char *)0x0) {
    sx_strncpy_cold_1();
    if (dst == (char *)0x0) {
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c"
                        ,0xe9,"dst");
      pcVar3 = (code *)swi(3);
      pcVar8 = (char *)(*pcVar3)();
      return pcVar8;
    }
    if (src_00 != (char *)0x0) {
      if (0 < dst_sz) {
        iVar7 = sx_strlen(dst);
        pcVar8 = sx_strcpy(dst + iVar7,dst_sz - iVar7,src_00);
        return pcVar8;
      }
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c"
                        ,0xeb,"dst_sz > 0");
      pcVar3 = (code *)swi(3);
      pcVar8 = (char *)(*pcVar3)();
      return pcVar8;
    }
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                      0xea,"src");
    pcVar3 = (code *)swi(3);
    pcVar8 = (char *)(*pcVar3)();
    return pcVar8;
  }
  iVar7 = (int)src;
  pcVar8 = src;
  uVar9 = _num;
  if (((ulong)src & 7) == 0) {
LAB_0010aa26:
    iVar5 = (int)pcVar8;
    lVar11 = 0;
    do {
      uVar2 = *(ulong *)(pcVar8 + lVar11);
      if ((~(0x101010101010100 - uVar2 | uVar2) & 0x8080808080808080) != 0) {
        iVar4 = (int)lVar11;
        if (_num < (iVar5 - iVar7) + iVar4) goto LAB_0010ab19;
        if ((char)uVar2 == '\0') {
          uVar9 = iVar4 + (iVar5 - iVar7);
          goto LAB_0010ab19;
        }
        if ((uVar2 & 0xff00) == 0) {
          uVar6 = (iVar5 - iVar7) + iVar4 + 1;
          goto LAB_0010ab12;
        }
        if ((uVar2 & 0xff0000) == 0) {
          uVar6 = (iVar5 - iVar7) + iVar4 + 2;
          goto LAB_0010ab12;
        }
        if ((char)(uVar2 >> 0x18) == '\0') {
          uVar6 = (iVar5 - iVar7) + iVar4 + 3;
          goto LAB_0010ab12;
        }
        if ((char)(uVar2 >> 0x20) == '\0') {
          uVar6 = (iVar5 - iVar7) + iVar4 + 4;
          goto LAB_0010ab12;
        }
        if ((char)(uVar2 >> 0x28) == '\0') {
          uVar6 = (iVar5 - iVar7) + iVar4 + 5;
          goto LAB_0010ab12;
        }
        if ((char)(uVar2 >> 0x30) == '\0') {
          uVar6 = (iVar5 - iVar7) + iVar4 + 6;
          goto LAB_0010ab12;
        }
        if (uVar2 >> 0x38 == 0) goto LAB_0010ab0a;
      }
      lVar11 = lVar11 + 8;
    } while( true );
  }
  iVar5 = iVar7;
  if (*src != '\0') {
    pcVar8 = src + 1;
    pcVar10 = src;
    do {
      if (((int)pcVar10 + 1U & 7) == 0) goto LAB_0010aa26;
      pcVar10 = pcVar10 + 1;
      iVar5 = (int)pcVar10;
      cVar1 = *pcVar8;
      pcVar8 = pcVar8 + 1;
    } while (cVar1 != '\0');
  }
  uVar9 = iVar5 - iVar7;
  if (_num <= iVar5 - iVar7) {
    uVar9 = _num;
  }
LAB_0010ab19:
  uVar6 = dst_sz - 1U;
  if ((int)uVar9 < (int)(dst_sz - 1U)) {
    uVar6 = uVar9;
  }
  if (0 < (int)uVar6) {
    memcpy(dst,src,(ulong)uVar6);
  }
  dst[(int)uVar6] = '\0';
  return dst + (int)uVar6;
LAB_0010ab0a:
  uVar6 = (iVar5 - iVar7) + iVar4 + 7;
LAB_0010ab12:
  if ((int)uVar6 < _num) {
    uVar9 = uVar6;
  }
  goto LAB_0010ab19;
}

Assistant:

char* sx_strncpy(char* SX_RESTRICT dst, int dst_sz, const char* SX_RESTRICT src, int _num)
{
    sx_assert(dst);
    sx_assert(src);

    const int len = sx__strnlen(src, _num);
    const int32_t max = dst_sz - 1;
    const int32_t num = (len < max ? len : max);
    if (num > 0) {
        sx_memcpy(dst, src, num);
    }
    dst[num] = '\0';

    return &dst[num];
}